

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O3

void Timidity::FreeAll(void)

{
  ToneBank *pTVar1;
  long lVar2;
  
  free_instruments();
  font_freeall();
  lVar2 = 0;
  do {
    pTVar1 = *(ToneBank **)((long)&tonebank + lVar2);
    if (pTVar1 != (ToneBank *)0x0) {
      ToneBank::~ToneBank(pTVar1);
      operator_delete(pTVar1,0x408);
      *(undefined8 *)((long)&tonebank + lVar2) = 0;
    }
    pTVar1 = *(ToneBank **)((long)&drumset + lVar2);
    if (pTVar1 != (ToneBank *)0x0) {
      ToneBank::~ToneBank(pTVar1);
      operator_delete(pTVar1,0x408);
      *(undefined8 *)((long)&drumset + lVar2) = 0;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x400);
  return;
}

Assistant:

void FreeAll()
{
	free_instruments();
	font_freeall();
	for (int i = 0; i < MAXBANK; ++i)
	{
		if (tonebank[i] != NULL)
		{
			delete tonebank[i];
			tonebank[i] = NULL;
		}
		if (drumset[i] != NULL)
		{
			delete drumset[i];
			drumset[i] = NULL;
		}
	}
}